

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

bool __thiscall inja::Parser::parse_expression_and(Parser *this,Template *tmpl)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  size_t local_30;
  char *local_28;
  Template *local_20;
  Template *tmpl_local;
  Parser *this_local;
  
  local_20 = tmpl;
  tmpl_local = (Template *)this;
  bVar1 = parse_expression_not(this,tmpl);
  if (bVar1) {
    if ((this->m_tok).kind == Id) {
      local_30 = (this->m_tok).text._M_len;
      local_28 = (this->m_tok).text._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"and");
      __x._M_str = local_28;
      __x._M_len = local_30;
      bVar1 = std::operator!=(__x,local_40);
      if (!bVar1) {
        get_next_token(this);
        bVar1 = parse_expression_not(this,local_20);
        if (!bVar1) {
          return false;
        }
        append_function(this,local_20,And,2);
        return true;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool parse_expression_and(Template& tmpl) {
    if (!parse_expression_not(tmpl)) return false;
    if (m_tok.kind != Token::Kind::Id || m_tok.text != static_cast<decltype(m_tok.text)>("and")) return true;
    get_next_token();
    if (!parse_expression_not(tmpl)) return false;
    append_function(tmpl, Bytecode::Op::And, 2);
    return true;
  }